

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * util::str<char[42],char[88],char[2],int>
                   (char (*args) [42],char (*args_1) [88],char (*args_2) [2],int *args_3)

{
  string *in_RDI;
  ostringstream ss;
  string *args_00;
  ostringstream *this;
  ostream *in_stack_fffffffffffffe50;
  ostringstream local_1a0 [416];
  
  this = local_1a0;
  args_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  detail::_str<char[42],char[88],char[2],int>
            (in_stack_fffffffffffffe50,(char (*) [42])this,(char (*) [88])args_00,
             (char (*) [2])in_RDI,(int *)0x2e2d44);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return args_00;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}